

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSFixed64Array
               (int64 *a,int n,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int n_local;
  int64 *a_local;
  
  WriteArray<long>(a,n,output);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed64Array(const int64* a, int n,
                                        io::CodedOutputStream* output) {
  WriteArray<int64>(a, n, output);
}